

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history_buffer.c
# Opt level: O0

void history_buffer_destroy(history_buffer *buf)

{
  void *in_RDI;
  uint i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(uint *)((long)in_RDI + 8); local_c = local_c + 1) {
    free(*(void **)(*(long *)((long)in_RDI + 0x18) + (ulong)local_c * 8));
  }
  free(*(void **)((long)in_RDI + 0x18));
  free(*(void **)((long)in_RDI + 0x28));
  free(in_RDI);
  return;
}

Assistant:

void history_buffer_destroy(history_buffer *buf) {
    for (unsigned int i = 0; i < buf->cap; i++) {
        free(buf->history[i]);
    }
    free(buf->history);
    free(buf->fetched);
    free(buf);
}